

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnectionchannel.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionChannel::_q_connected_abstract_socket
          (QHttpNetworkConnectionChannel *this,QAbstractSocket *absSocket)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  undefined8 uVar4;
  char cVar5;
  bool bVar6;
  NetworkLayerProtocol NVar7;
  ConnectionType CVar8;
  QHttp2ProtocolHandler *this_00;
  QHttpProtocolHandler *this_01;
  QHttpNetworkConnectionPrivate *this_02;
  QObject *pQVar9;
  QNetworkConnectionMonitor *this_03;
  long in_FS_OFFSET;
  shared_ptr<QSslContext> local_70;
  undefined1 local_60 [8];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(int *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x7c);
  if ((iVar1 == 1) || (iVar1 == 4)) {
    cVar5 = QTimer::isActive();
    if (cVar5 != '\0') {
      QTimer::stop();
    }
    if (*(int *)(this + 0xe8) == 1) {
      this_02 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
LAB_001f1a85:
      this_02->networkLayerState = IPv6;
    }
    else {
      if (*(int *)(this + 0xe8) == 0) {
        this_02 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
      }
      else {
        QAbstractSocket::peerAddress((QAbstractSocket *)local_58);
        NVar7 = QHostAddress::protocol((QHostAddress *)local_58);
        QHostAddress::~QHostAddress((QHostAddress *)local_58);
        this_02 = *(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8);
        if (NVar7 != IPv4Protocol) goto LAB_001f1a85;
      }
      this_02->networkLayerState = IPv4;
    }
    QHttpNetworkConnectionPrivate::networkLayerDetected
              (this_02,*(NetworkLayerProtocol *)(this + 0xe8));
    if (*(long *)(this + 0xf0) != 0) {
      lVar2 = *(long *)(*(QObject **)(this + 0xf8) + 8);
      if ((1 < *(int *)(lVar2 + 0xa0)) && (*(char *)(lVar2 + 0x9a) == '\0')) {
        pQVar9 = *(QObject **)(this + 0xf8);
        if (*(int *)(*(long *)(this + 0xf0) + 4) == 0) {
          pQVar9 = (QObject *)0x0;
        }
        QMetaObject::invokeMethod<>(pQVar9,"_q_startNextRequest",QueuedConnection);
      }
    }
  }
  else if (((iVar1 == 2) && ((*(uint *)(this + 0xe8) & 0xfffffffd) != 0)) ||
          (1 < *(uint *)(this + 0xe8) - 1 && iVar1 == 3)) {
    close(this,*(int *)(*(long *)(this + 0xf0) + 4));
    if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
      pQVar9 = (QObject *)0x0;
    }
    else {
      pQVar9 = *(QObject **)(this + 0xf8);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QMetaObject::invokeMethod<>(pQVar9,"_q_startNextRequest",QueuedConnection);
      return;
    }
    goto LAB_001f1e00;
  }
  QVariant::QVariant((QVariant *)local_58,1);
  (**(code **)(*(long *)absSocket + 0x120))(absSocket,1,(QVariant *)local_58);
  QVariant::~QVariant((QVariant *)local_58);
  *(undefined4 *)(this + 0xb0) = 0;
  bVar6 = QNetworkConnectionMonitor::isEnabled();
  if (bVar6) {
    this_03 = (QNetworkConnectionMonitor *)(*(long *)(*(long *)(this + 0xf8) + 8) + 0x130);
    bVar6 = QNetworkConnectionMonitor::isMonitoring(this_03);
    if (!bVar6) {
      QAbstractSocket::localAddress((QAbstractSocket *)local_58);
      QAbstractSocket::peerAddress((QAbstractSocket *)local_60);
      bVar6 = QNetworkConnectionMonitor::setTargets
                        (this_03,(QHostAddress *)local_58,(QHostAddress *)local_60);
      QHostAddress::~QHostAddress((QHostAddress *)local_60);
      QHostAddress::~QHostAddress((QHostAddress *)local_58);
      if (bVar6) {
        QNetworkConnectionMonitor::startMonitoring(this_03);
      }
    }
  }
  if ((this[0x18] == (QHttpNetworkConnectionChannel)0x0) &&
     (this[0x58] != (QHttpNetworkConnectionChannel)0x1)) {
    CVar8 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
    *(undefined4 *)(this + 0x20) = 0;
    if (CVar8 == ConnectionTypeHTTP2Direct) {
      this_00 = (QHttp2ProtocolHandler *)operator_new(0x58);
      QHttp2ProtocolHandler::QHttp2ProtocolHandler(this_00,(QHttpNetworkConnectionChannel *)this);
      plVar3 = *(long **)(this + 0x78);
      *(QHttp2ProtocolHandler **)(this + 0x78) = this_00 + 0x10;
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 8))();
      }
      if ((*(long *)(this + 0x80) != 0) && (0 < *(long *)(*(long *)(this + 0x80) + 0x30))) {
        if ((*(long *)(this + 0xf0) == 0) || (*(int *)(*(long *)(this + 0xf0) + 4) == 0)) {
          pQVar9 = (QObject *)0x0;
        }
        else {
          pQVar9 = *(QObject **)(this + 0xf8);
        }
        QMetaObject::invokeMethod<>(pQVar9,"_q_startNextRequest",QueuedConnection);
      }
    }
    else {
      CVar8 = QHttpNetworkConnection::connectionType(*(QHttpNetworkConnection **)(this + 0xf8));
      if (CVar8 == ConnectionTypeHTTP2) {
        this_01 = (QHttpProtocolHandler *)operator_new(0x40);
        QHttpProtocolHandler::QHttpProtocolHandler(this_01,(QHttpNetworkConnectionChannel *)this);
        plVar3 = *(long **)(this + 0x78);
        *(QHttpProtocolHandler **)(this + 0x78) = this_01;
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 8))();
        }
      }
      this[0x88] = (QHttpNetworkConnectionChannel)0x0;
      if (*(long *)(this + 0x38) == 0) {
        QHttpNetworkConnectionPrivate::dequeueRequest
                  (*(QHttpNetworkConnectionPrivate **)(*(long *)(this + 0xf8) + 8),
                   &absSocket->super_QIODevice);
        if (*(long *)(this + 0x38) == 0) goto LAB_001f1de1;
      }
      if (CVar8 == ConnectionTypeHTTP2) {
        QHttpNetworkConnection::http2Parameters((QHttpNetworkConnection *)local_58);
        Http2::appendProtocolUpgradeHeaders
                  ((QHttp2Configuration *)local_58,(QHttpNetworkRequest *)(this + 0x28));
        QHttp2Configuration::~QHttp2Configuration((QHttp2Configuration *)local_58);
      }
      sendRequest(this);
    }
  }
  else {
    QHttpNetworkConnection::sslContext((QHttpNetworkConnection *)local_58);
    uVar4 = local_58._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    if ((PrivateShared *)uVar4 == (PrivateShared *)0x0) {
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QSslSocketPrivate::sslContext((QSslSocketPrivate *)local_58,(QSslSocket *)absSocket);
      uVar4 = local_58._8_8_;
      if ((PrivateShared *)local_58._0_8_ != (PrivateShared *)0x0) {
        local_70.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_58._0_8_;
        local_58._8_8_ = (undefined1 *)0x0;
        local_70.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
        local_58._0_8_ = (PrivateShared *)0x0;
        QHttpNetworkConnection::setSslContext(*(QHttpNetworkConnection **)(this + 0xf8),&local_70);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_70.super___shared_ptr<QSslContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  );
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    }
  }
LAB_001f1de1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001f1e00:
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionChannel::_q_connected_abstract_socket(QAbstractSocket *absSocket)
{
    // For the Happy Eyeballs we need to check if this is the first channel to connect.
    if (connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::HostLookupPending || connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4or6) {
        if (connection->d_func()->delayedConnectionTimer.isActive())
            connection->d_func()->delayedConnectionTimer.stop();
        if (networkLayerPreference == QAbstractSocket::IPv4Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
        else if (networkLayerPreference == QAbstractSocket::IPv6Protocol)
            connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        else {
            if (absSocket->peerAddress().protocol() == QAbstractSocket::IPv4Protocol)
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            else
                connection->d_func()->networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
        }
        connection->d_func()->networkLayerDetected(networkLayerPreference);
        if (connection->d_func()->activeChannelCount > 1 && !connection->d_func()->encrypt)
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
    } else {
        bool anyProtocol = networkLayerPreference == QAbstractSocket::AnyIPProtocol;
        if (((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv4)
             && (networkLayerPreference != QAbstractSocket::IPv4Protocol && !anyProtocol))
            || ((connection->d_func()->networkLayerState == QHttpNetworkConnectionPrivate::IPv6)
                && (networkLayerPreference != QAbstractSocket::IPv6Protocol && !anyProtocol))) {
            close();
            // This is the second connection so it has to be closed and we can schedule it for another request.
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
        //The connections networkLayerState had already been decided.
    }

    // improve performance since we get the request sent by the kernel ASAP
    //absSocket->setSocketOption(QAbstractSocket::LowDelayOption, 1);
    // We have this commented out now. It did not have the effect we wanted. If we want to
    // do this properly, Qt has to combine multiple HTTP requests into one buffer
    // and send this to the kernel in one syscall and then the kernel immediately sends
    // it as one TCP packet because of TCP_NODELAY.
    // However, this code is currently not in Qt, so we rely on the kernel combining
    // the requests into one TCP packet.

    // not sure yet if it helps, but it makes sense
    absSocket->setSocketOption(QAbstractSocket::KeepAliveOption, 1);

    pipeliningSupported = QHttpNetworkConnectionChannel::PipeliningSupportUnknown;

    if (QNetworkConnectionMonitor::isEnabled()) {
        auto connectionPrivate = connection->d_func();
        if (!connectionPrivate->connectionMonitor.isMonitoring()) {
            // Now that we have a pair of addresses, we can start monitoring the
            // connection status to handle its loss properly.
            if (connectionPrivate->connectionMonitor.setTargets(absSocket->localAddress(), absSocket->peerAddress()))
                connectionPrivate->connectionMonitor.startMonitoring();
        }
    }

    // ### FIXME: if the server closes the connection unexpectedly, we shouldn't send the same broken request again!
    //channels[i].reconnectAttempts = 2;
    if (ssl || pendingEncrypt) { // FIXME: Didn't work properly with pendingEncrypt only, we should refactor this into an EncrypingState
#ifndef QT_NO_SSL
        if (!connection->sslContext()) {
            // this socket is making the 1st handshake for this connection,
            // we need to set the SSL context so new sockets can reuse it
            if (auto socketSslContext = QSslSocketPrivate::sslContext(static_cast<QSslSocket*>(absSocket)))
                connection->setSslContext(std::move(socketSslContext));
        }
#endif
    } else if (connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2Direct) {
        state = QHttpNetworkConnectionChannel::IdleState;
        protocolHandler.reset(new QHttp2ProtocolHandler(this));
        if (h2RequestsToSend.size() > 0) {
            // In case our peer has sent us its settings (window size, max concurrent streams etc.)
            // let's give _q_receiveReply a chance to read them first ('invokeMethod', QueuedConnection).
            QMetaObject::invokeMethod(connection, "_q_startNextRequest", Qt::QueuedConnection);
        }
    } else {
        state = QHttpNetworkConnectionChannel::IdleState;
        const bool tryProtocolUpgrade = connection->connectionType() == QHttpNetworkConnection::ConnectionTypeHTTP2;
        if (tryProtocolUpgrade) {
            // For HTTP/1.1 it's already created and never reset.
            protocolHandler.reset(new QHttpProtocolHandler(this));
        }
        switchedToHttp2 = false;

        if (!reply)
            connection->d_func()->dequeueRequest(absSocket);

        if (reply) {
            if (tryProtocolUpgrade) {
                // Let's augment our request with some magic headers and try to
                // switch to HTTP/2.
                Http2::appendProtocolUpgradeHeaders(connection->http2Parameters(), &request);
            }
            sendRequest();
        }
    }
}